

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O3

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::visitStmt
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this,BlockStatement *stmt)

{
  size_t *psVar1;
  DataFlowState *source;
  group_type_pointer pgVar2;
  byte bVar3;
  undefined4 uVar4;
  StatementSyntax *this_00;
  group_type_pointer pgVar5;
  value_type_pointer ppVar6;
  size_type sVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  size_t sVar11;
  long lVar12;
  ulong pos0;
  ulong uVar13;
  long lVar14;
  value_type *elements;
  StatementBlockSymbol *pSVar15;
  EVP_PKEY_CTX *arrays_;
  ulong hash;
  ulong uVar16;
  group15<boost::unordered::detail::foa::plain_integral> *pg;
  Statement **ppSVar17;
  StatementSyntax **ppSVar18;
  slot_type *psVar19;
  uint uVar20;
  StatementSyntax **ppSVar21;
  DataFlowState *branchState;
  long lVar22;
  ulong uVar23;
  BlockStatement *pBVar24;
  pointer other;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  byte bVar28;
  uchar uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  try_emplace_args_t local_391;
  Statement *stmtPtr;
  StatementSyntax *local_388;
  BlockStatement *local_380;
  uchar local_378;
  uchar uStack_377;
  uchar uStack_376;
  byte bStack_375;
  uchar uStack_374;
  uchar uStack_373;
  uchar uStack_372;
  byte bStack_371;
  uchar uStack_370;
  uchar uStack_36f;
  uchar uStack_36e;
  byte bStack_36d;
  uchar uStack_36c;
  uchar uStack_36b;
  uchar uStack_36a;
  byte bStack_369;
  locator res;
  group15<boost::unordered::detail::foa::plain_integral> local_350 [8];
  bool local_2d0;
  DataFlowState local_2c8;
  DataFlowState currState;
  DataFlowState local_d0;
  
  pSVar15 = stmt->blockSymbol;
  local_380 = stmt;
  if (pSVar15 != (StatementBlockSymbol *)0x0) {
    arrays_ = (EVP_PKEY_CTX *)&this->disableBranches;
    currState.assigned.super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
    .data_ = (pointer)currState.assigned.
                      super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                      firstElement;
    currState.assigned.super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
    .len = 0;
    currState.assigned.super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
    .cap = 2;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = pSVar15;
    hash = SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),0);
    pos0 = hash >> ((byte)(this->disableBranches).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
                          .arrays.groups_size_index & 0x3f);
    uVar4 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[hash & 0xff];
    uVar13 = (this->disableBranches).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
             .arrays.groups_size_mask;
    uVar16 = 0;
    uVar23 = pos0;
    do {
      pgVar5 = (this->disableBranches).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
               .arrays.groups_ + uVar23;
      local_378 = pgVar5->m[0].n;
      uStack_377 = pgVar5->m[1].n;
      uStack_376 = pgVar5->m[2].n;
      bStack_375 = pgVar5->m[3].n;
      uStack_374 = pgVar5->m[4].n;
      uStack_373 = pgVar5->m[5].n;
      uStack_372 = pgVar5->m[6].n;
      bStack_371 = pgVar5->m[7].n;
      uStack_370 = pgVar5->m[8].n;
      uStack_36f = pgVar5->m[9].n;
      uStack_36e = pgVar5->m[10].n;
      bStack_36d = pgVar5->m[0xb].n;
      uStack_36c = pgVar5->m[0xc].n;
      uStack_36b = pgVar5->m[0xd].n;
      uStack_36a = pgVar5->m[0xe].n;
      bStack_369 = pgVar5->m[0xf].n;
      uVar25 = (uchar)uVar4;
      auVar30[0] = -(local_378 == uVar25);
      uVar26 = (uchar)((uint)uVar4 >> 8);
      auVar30[1] = -(uStack_377 == uVar26);
      uVar27 = (uchar)((uint)uVar4 >> 0x10);
      auVar30[2] = -(uStack_376 == uVar27);
      bVar28 = (byte)((uint)uVar4 >> 0x18);
      auVar30[3] = -(bStack_375 == bVar28);
      auVar30[4] = -(uStack_374 == uVar25);
      auVar30[5] = -(uStack_373 == uVar26);
      auVar30[6] = -(uStack_372 == uVar27);
      auVar30[7] = -(bStack_371 == bVar28);
      auVar30[8] = -(uStack_370 == uVar25);
      auVar30[9] = -(uStack_36f == uVar26);
      auVar30[10] = -(uStack_36e == uVar27);
      auVar30[0xb] = -(bStack_36d == bVar28);
      auVar30[0xc] = -(uStack_36c == uVar25);
      auVar30[0xd] = -(uStack_36b == uVar26);
      auVar30[0xe] = -(uStack_36a == uVar27);
      auVar30[0xf] = -(bStack_369 == bVar28);
      for (uVar20 = (uint)(ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe);
          stmtPtr = (Statement *)pSVar15, uVar20 != 0; uVar20 = uVar20 - 1 & uVar20) {
        uVar8 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
          }
        }
        if (pSVar15 ==
            (StatementBlockSymbol *)
            (this->disableBranches).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
            .arrays.elements_[uVar23 * 0xf + (ulong)uVar8].first) goto LAB_0037e726;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_369) == 0) break;
      lVar22 = uVar23 + uVar16;
      uVar16 = uVar16 + 1;
      uVar23 = lVar22 + 1U & uVar13;
    } while (uVar16 <= uVar13);
    if ((this->disableBranches).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
        .size_ctrl.size <
        (this->disableBranches).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<slang::analysis::DataFlowState,2ul>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>
                (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<slang::analysis::DataFlowState,2ul>>>>
                       *)arrays_,(arrays_type *)arrays_,pos0,hash,&local_391,(Symbol **)&stmtPtr,
                 (SmallVector<slang::analysis::DataFlowState,_2UL> *)&currState);
      psVar1 = &(this->disableBranches).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<slang::analysis::DataFlowState,2ul>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>
                (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<slang::analysis::DataFlowState,2ul>>>>
                       *)arrays_,hash,&local_391,(Symbol **)&stmtPtr,
                 (SmallVector<slang::analysis::DataFlowState,_2UL> *)&currState);
    }
LAB_0037e726:
    SmallVectorBase<slang::analysis::DataFlowState>::cleanup
              ((SmallVectorBase<slang::analysis::DataFlowState> *)&currState,arrays_);
  }
  pBVar24 = local_380;
  if (local_380->blockKind == Sequential) {
    ast::Statement::visit<slang::analysis::DataFlowAnalysis&>
              (local_380->body,(DataFlowAnalysis *)this);
    goto LAB_0037e91d;
  }
  stmtPtr = local_380->body;
  if (stmtPtr->kind == List) {
    ppSVar17 = *(Statement ***)(stmtPtr + 1);
    local_388 = stmtPtr[1].syntax;
    ppSVar21 = (StatementSyntax **)(ppSVar17 + (long)local_388);
    if (local_388 != (StatementSyntax *)0x0) goto LAB_0037e79c;
    local_388 = (StatementSyntax *)0x0;
    lVar22 = 0;
  }
  else {
    local_388 = (StatementSyntax *)0x1;
    ppSVar17 = &stmtPtr;
    ppSVar21 = &local_388;
LAB_0037e79c:
    lVar14 = 0;
    lVar22 = 0;
    do {
      if (ppSVar17[lVar22]->kind != VariableDeclaration) break;
      ast::Statement::visit<slang::analysis::DataFlowAnalysis&>
                (ppSVar17[lVar22],(DataFlowAnalysis *)this);
      lVar22 = lVar22 + 1;
      lVar12 = lVar14 + 8;
      lVar14 = lVar14 + 8;
    } while ((StatementSyntax **)((long)ppSVar17 + lVar12) != ppSVar21);
  }
  source = &this->state;
  DataFlowAnalysis::copyState(&currState,(DataFlowAnalysis *)this,source);
  SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL>::SmallVector
            ((SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL> *)&res,
             (Base *)source);
  local_2d0 = (this->state).reachable;
  local_388 = (StatementSyntax *)((long)local_388 - lVar22);
  if (local_388 != (StatementSyntax *)0x0) {
    ppSVar18 = (StatementSyntax **)(ppSVar17 + lVar22);
    do {
      this_00 = *ppSVar18;
      DataFlowAnalysis::copyState(&local_2c8,(DataFlowAnalysis *)this,&currState);
      setState(this,&local_2c8);
      if (local_2c8.assigned.
          super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_ !=
          (pointer)local_2c8.assigned.
                   super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                   firstElement) {
        operator_delete(local_2c8.assigned.
                        super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
                        .data_);
      }
      ast::Statement::visit<slang::analysis::DataFlowAnalysis&>
                ((Statement *)this_00,(DataFlowAnalysis *)this);
      if (local_380->blockKind == JoinAll) {
LAB_0037e878:
        DataFlowAnalysis::meetState((DataFlowAnalysis *)this,(DataFlowState *)&res,source);
      }
      else if (local_380->blockKind == JoinAny) {
        if (local_388 == (StatementSyntax *)0x1) goto LAB_0037e878;
        DataFlowAnalysis::joinState((DataFlowAnalysis *)this,(DataFlowState *)&res,source);
      }
      ppSVar18 = ppSVar18 + 1;
    } while (ppSVar18 != ppSVar21);
  }
  SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL>::SmallVector
            (&local_d0.assigned,(Base *)&res);
  local_d0.reachable = local_2d0;
  setState(this,&local_d0);
  pBVar24 = local_380;
  if (local_d0.assigned.
      super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_ !=
      (pointer)local_d0.assigned.
               super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
               firstElement) {
    operator_delete(local_d0.assigned.
                    super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                    data_);
  }
  if (res.pg != local_350) {
    operator_delete(res.pg);
  }
  if (currState.assigned.
      super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_ !=
      (pointer)currState.assigned.
               super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
               firstElement) {
    operator_delete(currState.assigned.
                    super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                    data_);
  }
LAB_0037e91d:
  pSVar15 = pBVar24->blockSymbol;
  if (pSVar15 == (StatementBlockSymbol *)0x0) {
    return;
  }
  auVar10._8_8_ = 0;
  auVar10._0_8_ = pSVar15;
  uVar23 = SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar13 = uVar23 >> ((byte)(this->disableBranches).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  pgVar5 = (this->disableBranches).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
           .arrays.groups_;
  uVar4 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar23 & 0xff];
  ppVar6 = (this->disableBranches).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
           .arrays.elements_;
  lVar22 = 0;
  do {
    pgVar2 = pgVar5 + uVar13;
    uVar25 = (uchar)uVar4;
    auVar31[0] = -(pgVar2->m[0].n == uVar25);
    uVar26 = (uchar)((uint)uVar4 >> 8);
    auVar31[1] = -(pgVar2->m[1].n == uVar26);
    uVar27 = (uchar)((uint)uVar4 >> 0x10);
    auVar31[2] = -(pgVar2->m[2].n == uVar27);
    uVar29 = (uchar)((uint)uVar4 >> 0x18);
    auVar31[3] = -(pgVar2->m[3].n == uVar29);
    auVar31[4] = -(pgVar2->m[4].n == uVar25);
    auVar31[5] = -(pgVar2->m[5].n == uVar26);
    auVar31[6] = -(pgVar2->m[6].n == uVar27);
    auVar31[7] = -(pgVar2->m[7].n == uVar29);
    auVar31[8] = -(pgVar2->m[8].n == uVar25);
    auVar31[9] = -(pgVar2->m[9].n == uVar26);
    auVar31[10] = -(pgVar2->m[10].n == uVar27);
    auVar31[0xb] = -(pgVar2->m[0xb].n == uVar29);
    auVar31[0xc] = -(pgVar2->m[0xc].n == uVar25);
    auVar31[0xd] = -(pgVar2->m[0xd].n == uVar26);
    auVar31[0xe] = -(pgVar2->m[0xe].n == uVar27);
    auVar31[0xf] = -(pgVar2->m[0xf].n == uVar29);
    for (uVar20 = (uint)(ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe); uVar20 != 0;
        uVar20 = uVar20 - 1 & uVar20) {
      uVar8 = 0;
      if (uVar20 != 0) {
        for (; (uVar20 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
        }
      }
      uVar23 = (ulong)uVar8;
      if (pSVar15 == (StatementBlockSymbol *)ppVar6[uVar13 * 0xf + uVar23].first) {
        psVar19 = pgVar5[uVar13].m + uVar23;
        sVar7 = ppVar6[uVar13 * 0xf + uVar23].second.
                super_SmallVectorBase<slang::analysis::DataFlowState>.len;
        if (sVar7 != 0) {
          other = ppVar6[uVar13 * 0xf + uVar23].second.
                  super_SmallVectorBase<slang::analysis::DataFlowState>.data_;
          lVar22 = sVar7 * 0xa0;
          do {
            pSVar15 = (StatementBlockSymbol *)&this->state;
            DataFlowAnalysis::joinState((DataFlowAnalysis *)this,&this->state,other);
            other = other + 1;
            lVar22 = lVar22 + -0xa0;
          } while (lVar22 != 0);
        }
        SmallVectorBase<slang::analysis::DataFlowState>::cleanup
                  (&ppVar6[uVar13 * 0xf + uVar23].second.
                    super_SmallVectorBase<slang::analysis::DataFlowState>,(EVP_PKEY_CTX *)pSVar15);
        bVar28 = (&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[psVar19->n & 7];
        bVar3 = *(byte *)((ulong)psVar19 | 0xf);
        psVar19->n = '\0';
        sVar11 = (this->disableBranches).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
                 .size_ctrl.size;
        (this->disableBranches).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
        .size_ctrl.ml =
             (this->disableBranches).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
             .size_ctrl.ml - (ulong)((bVar28 & bVar3) != 0);
        (this->disableBranches).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
        .size_ctrl.size = sVar11 - 1;
        return;
      }
    }
    lVar14 = uVar13 + lVar22;
    lVar22 = lVar22 + 1;
    uVar13 = lVar14 + 1U &
             (this->disableBranches).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
             .arrays.groups_size_mask;
  } while( true );
}

Assistant:

void visitStmt(const BlockStatement& stmt) {
        // This block could be the target of a disable statement.
        if (stmt.blockSymbol) {
            auto [it, inserted] = disableBranches.try_emplace(stmt.blockSymbol,
                                                              SmallVector<TState>{});
            SLANG_ASSERT(inserted);
        }

        if (stmt.blockKind == StatementBlockKind::Sequential) {
            visit(stmt.body);
        }
        else {
            auto stmtPtr = &stmt.body;
            auto statements = stmt.body.kind == StatementKind::List
                                  ? stmt.body.as<StatementList>().list
                                  : std::span(&stmtPtr, 1);
            size_t numLocalDecls = 0;
            for (auto s : statements) {
                // Variable declaration initializers happen before
                // we fork the remaining statements.
                if (s->kind == StatementKind::VariableDeclaration) {
                    visit(*s);
                    numLocalDecls++;
                }
                else {
                    break;
                }
            }
            statements = statements.subspan(numLocalDecls);

            // Each remaining statement is executed in parallel.
            auto currState = (DERIVED).copyState(state);
            auto finalState = std::move(state);
            for (auto s : statements) {
                setState((DERIVED).copyState(currState));
                visit(*s);

                switch (stmt.blockKind) {
                    case StatementBlockKind::JoinAny:
                        // If there's only one statement (a pathological case)
                        // then we can meet it; otherwise we must join since
                        // there is uncertainty about which path was taken.
                        if (statements.size() == 1)
                            (DERIVED).meetState(finalState, state);
                        else
                            (DERIVED).joinState(finalState, state);
                        break;
                    case StatementBlockKind::JoinAll:
                        // All paths must be taken, so we meet the states.
                        (DERIVED).meetState(finalState, state);
                        break;
                    case StatementBlockKind::JoinNone:
                        // No paths will be taken by the time the fork
                        // moves on so we discard this state.
                        break;
                    default:
                        SLANG_UNREACHABLE;
                }
            }
            setState(std::move(finalState));
        }

        // Once we're done with a block we remove it as a disable target.
        // A disable statement can target any block in the hierarchy but
        // we don't analyze the control flow implications for targets that
        // aren't part of the current execution stack.
        if (stmt.blockSymbol) {
            auto it = disableBranches.find(stmt.blockSymbol);
            SLANG_ASSERT(it != disableBranches.end());

            for (auto& branchState : it->second)
                (DERIVED).joinState(state, branchState);

            disableBranches.erase(it);
        }
    }